

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets_smart.cpp
# Opt level: O2

void calcola_wavelet_minus(vector<double,_std::allocator<double>_> *v,string *stringa)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  ostream *poVar4;
  size_t i;
  long lVar5;
  ulong uVar6;
  size_t i_2;
  vector<double,_std::allocator<double>_> first;
  _Vector_base<double,_std::allocator<double>_> local_558;
  string local_540 [32];
  ofstream ofi;
  ostringstream ostring3;
  ostringstream ostring;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ostring);
  poVar4 = std::operator<<((ostream *)&ostring,"wavelet_");
  poVar4 = std::operator<<(poVar4,(string *)stringa);
  std::operator<<(poVar4,".txt");
  pdVar1 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  pdVar2 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::clear(&v_coeff_w_plus);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::clear(&v_coeff_w_minus);
  if (variance_plus.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      variance_plus.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start) {
    variance_plus.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish =
         variance_plus.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  if (variance_minus.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      variance_minus.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start) {
    variance_minus.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish =
         variance_minus.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  first.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  first.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  first.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  for (lVar5 = 0; lVar5 <= (int)((ulong)((long)pdVar1 - (long)pdVar2) >> 3); lVar5 = lVar5 + 2) {
    pdVar3 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    _ofi = (pdVar3[lVar5] + pdVar3[lVar5 + 1]) * 0.5;
    std::vector<double,_std::allocator<double>_>::push_back(&first,(value_type *)&ofi);
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_558,&first);
  wavelet_pass_minus((vector<double,_std::allocator<double>_> *)&local_558);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_558);
  lVar5 = 0;
  for (uVar6 = 0;
      uVar6 < (ulong)(((long)v_coeff_w_plus.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)v_coeff_w_plus.
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar6 = uVar6 + 1) {
    _ofi = varianza<double>((vector<double,_std::allocator<double>_> *)
                            ((long)&((v_coeff_w_plus.
                                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                    super__Vector_impl_data._M_start + lVar5));
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&variance_plus,(double *)&ofi);
    lVar5 = lVar5 + 0x18;
  }
  lVar5 = 0;
  for (uVar6 = 0;
      uVar6 < (ulong)(((long)v_coeff_w_minus.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)v_coeff_w_minus.
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar6 = uVar6 + 1) {
    _ofi = varianza<double>((vector<double,_std::allocator<double>_> *)
                            ((long)&((v_coeff_w_minus.
                                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                    super__Vector_impl_data._M_start + lVar5));
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&variance_minus,(double *)&ofi);
    lVar5 = lVar5 + 0x18;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ostring3);
  poVar4 = std::operator<<((ostream *)&ostring3,"wavelet_");
  poVar4 = std::operator<<(poVar4,(string *)stringa);
  std::operator<<(poVar4,"coeff.txt");
  std::__cxx11::stringbuf::str();
  std::ofstream::ofstream(&ofi,local_540,_S_out);
  std::__cxx11::string::~string(local_540);
  for (uVar6 = 0;
      uVar6 < (ulong)((long)variance_plus.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)variance_plus.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3); uVar6 = uVar6 + 1) {
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&ofi);
    std::operator<<(poVar4,"\t");
    poVar4 = std::ostream::_M_insert<double>
                       (variance_plus.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar6]);
    std::operator<<(poVar4,"\t");
    poVar4 = std::ostream::_M_insert<double>
                       (variance_minus.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar6]);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&ofi);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ostring3);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&first.super__Vector_base<double,_std::allocator<double>_>);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ostring);
  return;
}

Assistant:

void calcola_wavelet_minus(vector<double> v, string stringa) {
	ostringstream ostring;
	ostring << "wavelet_" << stringa << ".txt";
	int size = v.size(); 

	v_coeff_w_plus.clear();
	v_coeff_w_minus.clear();
	variance_plus.clear();
	variance_minus.clear();

	vector<double> first;
	for(int i = 0; i < size + 1; i += 2) {
		double m = (v[i] + v[i + 1]) / 2.;
		first.push_back(m);
	};

	wavelet_pass_minus(first);


	for(size_t i = 0; i < v_coeff_w_plus.size(); i++)variance_plus.push_back(varianza(v_coeff_w_plus[i]));

	for(size_t i = 0; i < v_coeff_w_minus.size(); i++)variance_minus.push_back(varianza(v_coeff_w_minus[i]));
	
	//ofstream ofi_coeff_p("coeff_plus.txt");

	//for(int i = 0; i < v_coeff_w_plus.size(); i++) {
	//	for(int j = 0; j < v_coeff_w_plus[i].size(); j++)ofi_coeff_p << v_coeff_w_plus[i][j] << " ";
	//	ofi_coeff_p << endl;
	//}

	ostringstream ostring3;
	ostring3 << "wavelet_" << stringa << "coeff.txt";
	ofstream ofi(ostring3.str());
	for(size_t i = 0; i < variance_plus.size(); i++)ofi << v_coeff_w_plus[i].size() << "\t" << variance_plus[i] << "\t" << variance_minus[i] << endl;
	ofi.close();

}